

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_Complex_Test::Body
          (iu_SyntaxTest_x_iutest_x_Complex_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  complex<float> cVar4;
  AssertionHelper local_808;
  _ComplexT_conflict local_7d8;
  Fixed local_7d0;
  complex<float> local_648;
  undefined1 local_640 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_610 [4];
  float d_3;
  _ComplexT_conflict local_5e0;
  Fixed local_5d8;
  complex<float> local_450;
  undefined1 local_448 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_418 [4];
  float d_2;
  _ComplexT_conflict local_3e8;
  Fixed local_3e0;
  complex<float> local_258;
  undefined1 local_250 [8];
  AssertionResult iutest_ar_1;
  float d_1;
  _ComplexT_conflict local_1f0;
  Fixed local_1e8;
  complex<float> local_50;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  complex<float> cStack_18;
  float d;
  complex<float> c;
  iu_SyntaxTest_x_iutest_x_Complex_Test *this_local;
  
  c._M_value = (_ComplexT_conflict)this;
  std::complex<float>::complex(&stack0xffffffffffffffe8,1.0,1.0);
  iutest_ar._36_4_ = 0x3f800000;
  iutest::detail::AlwaysZero();
  std::complex<float>::complex(&local_50,(float)iutest_ar._36_4_,(float)iutest_ar._36_4_);
  iutest::internal::CmpHelperFloatingPointComplexEQ<float>
            ((AssertionResult *)local_48,"::std::complex<float>(d, d)","c",&local_50,
             &stack0xffffffffffffffe8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    cVar4._M_value = 0;
    memset(&local_1e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e8);
    local_1f0 = cStack_18._M_value;
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1e8,cVar4);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_48);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&d_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xe3,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&d_1,pFVar2);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&d_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = false;
    iutest_ar_1._33_3_ = 0x3f8000;
    iutest::detail::AlwaysZero();
    std::complex<float>::complex(&local_258,(float)iutest_ar_1._32_4_,(float)iutest_ar_1._32_4_);
    iutest::internal::CmpHelperFloatingPointComplexEQ<float>
              ((AssertionResult *)local_250,"::std::complex<float>(d, d)","c",&local_258,
               &stack0xffffffffffffffe8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      cVar4._M_value = 0;
      memset(&local_3e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e0);
      local_3e8 = cStack_18._M_value;
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3e0,cVar4);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_250);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xe5,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_418,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_418);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    iutest_ar_2._36_4_ = 0x3f800000;
    iutest::detail::AlwaysZero();
    std::complex<float>::complex(&local_450,(float)iutest_ar_2._36_4_,(float)iutest_ar_2._36_4_);
    iutest::internal::CmpHelperFloatingPointComplexEQ<float>
              ((AssertionResult *)local_448,"::std::complex<float>(d, d)","c",&local_450,
               &stack0xffffffffffffffe8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar1) {
      cVar4._M_value = 0;
      memset(&local_5d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5d8);
      local_5e0 = cStack_18._M_value;
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5d8,cVar4);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_448);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xe7,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_610,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_610);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    iutest_ar_3._36_4_ = 0x3f800000;
    iutest::detail::AlwaysZero();
    std::complex<float>::complex(&local_648,(float)iutest_ar_3._36_4_,(float)iutest_ar_3._36_4_);
    iutest::internal::CmpHelperFloatingPointComplexEQ<float>
              ((AssertionResult *)local_640,"::std::complex<float>(d, d)","c",&local_648,
               &stack0xffffffffffffffe8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
    if (!bVar1) {
      cVar4._M_value = 0;
      memset(&local_7d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7d0);
      local_7d8 = cStack_18._M_value;
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7d0,cVar4);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_640);
      iutest::AssertionHelper::AssertionHelper
                (&local_808,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xe9,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_808,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_808);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7d0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  }
  return;
}

Assistant:

TEST(SyntaxTest, Complex)
{
    ::std::complex<float> c(1.0f, 1.0f);
    if( float d = 1.0f )
        ASSERT_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
    if( float d = 1.0f )
        EXPECT_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
    if( float d = 1.0f )
        INFORM_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
    if( float d = 1.0f )
        ASSUME_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
}